

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_duplex_rb_init(ma_format captureFormat,ma_uint32 captureChannels,ma_uint32 sampleRate,
                           ma_uint32 captureInternalSampleRate,
                           ma_uint32 captureInternalPeriodSizeInFrames,
                           ma_allocation_callbacks *pAllocationCallbacks,ma_duplex_rb *pRB)

{
  ma_uint64 mVar1;
  ma_uint32 in_ECX;
  ma_uint32 in_EDX;
  undefined4 in_ESI;
  int in_R8D;
  ma_pcm_rb *in_R9;
  ma_uint32 sizeInFrames;
  ma_result result;
  ma_uint32 in_stack_fffffffffffffffc;
  ma_result mVar2;
  
  mVar1 = ma_calculate_frame_count_after_resampling(in_EDX,in_ECX,(ulong)(uint)(in_R8D * 5));
  if ((int)mVar1 == 0) {
    mVar2 = MA_INVALID_ARGS;
  }
  else {
    mVar2 = ma_pcm_rb_init(result,sizeInFrames,in_stack_fffffffffffffffc,
                           (void *)CONCAT44(in_ESI,in_EDX),
                           (ma_allocation_callbacks *)CONCAT44(in_ECX,in_R8D),in_R9);
    if (mVar2 == MA_SUCCESS) {
      ma_pcm_rb_seek_write((ma_pcm_rb *)CONCAT44(in_ECX,in_R8D),(ma_uint32)((ulong)in_R9 >> 0x20));
      mVar2 = MA_SUCCESS;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_duplex_rb_init(ma_format captureFormat, ma_uint32 captureChannels, ma_uint32 sampleRate, ma_uint32 captureInternalSampleRate, ma_uint32 captureInternalPeriodSizeInFrames, const ma_allocation_callbacks* pAllocationCallbacks, ma_duplex_rb* pRB)
{
    ma_result result;
    ma_uint32 sizeInFrames;

    sizeInFrames = (ma_uint32)ma_calculate_frame_count_after_resampling(sampleRate, captureInternalSampleRate, captureInternalPeriodSizeInFrames * 5);
    if (sizeInFrames == 0) {
        return MA_INVALID_ARGS;
    }

    result = ma_pcm_rb_init(captureFormat, captureChannels, sizeInFrames, NULL, pAllocationCallbacks, &pRB->rb);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* Seek forward a bit so we have a bit of a buffer in case of desyncs. */
    ma_pcm_rb_seek_write((ma_pcm_rb*)pRB, captureInternalPeriodSizeInFrames * 2);

    return MA_SUCCESS;
}